

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Aig_Man_t * Saig_BmcIntervalToAig(Saig_Bmc_t *p)

{
  void *pvVar1;
  Vec_Int_t *p_00;
  long lVar2;
  Aig_Man_t *pNew;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pDriver;
  long lVar4;
  
  pVVar3 = p->pFrm->vObjs;
  lVar2 = (long)pVVar3->nSize;
  if (0 < lVar2) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && (*(long *)((long)pvVar1 + 0x28) != 0)) {
        __assert_fail("pObj->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                      ,0x221,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
  }
  pNew = Aig_ManStart(p->nNodesMax);
  p->pFrm->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  p_00 = p->vVisited;
  p_00->nSize = 0;
  Vec_IntPush(p_00,p->pFrm->pConst1->Id);
  pVVar3 = p->vTargets;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      pDriver = Saig_BmcIntervalToAig_rec
                          (p,pNew,(Aig_Obj_t *)((ulong)pVVar3->pArray[lVar2] & 0xfffffffffffffffe));
      if (((ulong)pDriver & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObjNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                      ,0x22b,"Aig_Man_t *Saig_BmcIntervalToAig(Saig_Bmc_t *)");
      }
      Aig_ObjCreateCo(pNew,pDriver);
      lVar2 = lVar2 + 1;
      pVVar3 = p->vTargets;
    } while (lVar2 < pVVar3->nSize);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Saig_BmcIntervalToAig( Saig_Bmc_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    Aig_ManForEachObj( p->pFrm, pObj, i )
        assert( pObj->pData == NULL );

    pNew = Aig_ManStart( p->nNodesMax );
    Aig_ManConst1(p->pFrm)->pData = Aig_ManConst1(pNew);
    Vec_IntClear( p->vVisited );
    Vec_IntPush( p->vVisited, Aig_ObjId(Aig_ManConst1(p->pFrm)) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
    {
//        assert( !Aig_ObjIsConst1(Aig_Regular(pObj)) );
        pObjNew = Saig_BmcIntervalToAig_rec( p, pNew, Aig_Regular(pObj) );
        assert( !Aig_IsComplement(pObjNew) );
        Aig_ObjCreateCo( pNew, pObjNew );
    } 
    return pNew;
}